

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_range_assignment_Test::TestBody(VectorSUnitTest_range_assignment_Test *this)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first;
  pointer insert_ptr;
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  int *piVar2;
  char *pcVar3;
  char *in_R9;
  long *plVar4;
  pointer *__ptr;
  long lVar5;
  initializer_list<int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs_src;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> vs
  ;
  vector<int,_std::allocator<int>_> v_src;
  vector_s<int,_10UL> v;
  AssertHelper local_220;
  undefined1 local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  AssertHelper local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  AssertHelper local_1d0;
  undefined1 local_1c8 [8];
  undefined1 auStack_1c0 [24];
  string local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  long *local_148 [2];
  long local_138 [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  vector<int,_std::allocator<int>_> local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  int local_50 [10];
  int *local_28;
  
  local_1c8 = (undefined1  [8])&DAT_100000000;
  auStack_1c0._0_8_ = &DAT_300000002;
  auStack_1c0._8_4_ = 4;
  __l._M_len = 5;
  __l._M_array = (iterator)local_1c8;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_58);
  piVar2 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = local_50;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       estl::vector_s<int,10ul>::
       check_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                 ((vector_s<int,10ul> *)&local_58,
                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  piVar1 = local_28;
  for (; piVar2 != local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    *piVar1 = *piVar2;
    piVar1 = piVar1 + 1;
  }
  local_218[0] = (internal)
                 (local_58._M_head_impl !=
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_218,(AssertionResult *)0x15816a,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x11c,(char *)local_1c8);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    if (local_1c8 != (undefined1  [8])(auStack_1c0 + 8)) {
      operator_delete((void *)local_1c8,CONCAT44(auStack_1c0._12_4_,auStack_1c0._8_4_) + 1);
    }
    if ((long *)CONCAT44(local_1e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_1e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_1e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_210,local_210);
  }
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  local_218 = (undefined1  [8])local_58._M_head_impl;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c8,"5u","v.size()",(uint *)&local_1e8,(unsigned_long *)local_218);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x11d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"static_cast<int>(0)","v[0]",(int *)local_218,local_28);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x11e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_218._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"1","v[1]",(int *)local_218,local_28 + 1);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_218._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"2","v[2]",(int *)local_218,local_28 + 2);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x120,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_218._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"3","v[3]",(int *)local_218,local_28 + 3);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x121,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_218._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"4","v[4]",(int *)local_218,local_28 + 4);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)auStack_1c0._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x122,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_1c0._0_8_);
  }
  local_1c8 = (undefined1  [8])(auStack_1c0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"0","");
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>(local_1a8,"1","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"2","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"3","");
  plVar4 = local_138;
  local_148[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"4","");
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,__l_00,(allocator_type *)local_218);
  lVar5 = -0xa0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_1c8 = (undefined1  [8])0x0;
  first._M_current._4_4_ =
       local_1e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  first._M_current._0_4_ =
       local_1e8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1c0;
  estl::vector_s<std::__cxx11::string,10ul>::
  assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector_s<std::__cxx11::string,10ul> *)local_1c8,first,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_1f8.data_._0_1_ = (internal)(local_1c8 != (undefined1  [8])0x0);
  local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1c8 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_218,(internal *)&local_1f8,(AssertionResult *)"vs.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x127,(char *)local_218);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_218 != (undefined1  [8])&local_208) {
      operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_220.data_._4_4_,local_220.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_220.data_._4_4_,local_220.data_._0_4_) + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  local_220.data_._0_4_ = 5;
  local_1f8.data_ = (AssertHelperData *)local_1c8;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_218,"5u","vs.size()",(uint *)&local_220,(unsigned_long *)&local_1f8);
  if (local_218[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_210 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_210->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_1f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f8.data_ + 8))();
    }
  }
  if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_210,local_210);
  }
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"0","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1f8,"std::string(\"0\")","vs[0]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,local_80
            );
  if (local_218 != (undefined1  [8])&local_208) {
    operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
  }
  if (local_1f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"1","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1f8,"std::string(\"1\")","vs[1]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             local_80 + 1);
  if (local_218 != (undefined1  [8])&local_208) {
    operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
  }
  if (local_1f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x12a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_218 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"2","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1f8,"std::string(\"2\")","vs[2]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             local_80 + 2);
  if (local_218 != (undefined1  [8])&local_208) {
    operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
  }
  if (local_1f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,299,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"3","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1f8,"std::string(\"3\")","vs[3]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             local_80 + 3);
  if (local_218 != (undefined1  [8])&local_208) {
    operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
  }
  if (local_1f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,300,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"4","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1f8,"std::string(\"4\")","vs[4]",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             local_80 + 4);
  if (local_218 != (undefined1  [8])&local_208) {
    operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
  }
  if (local_1f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if (local_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x12d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_218 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_218 + 8))();
    }
  }
  if (local_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f0,local_1f0);
  }
  estl::
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
  destroy_elements((vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                    *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, range_assignment)
{
    std::vector<int> v_src{0,1,2,3,4};

    vector_s<int, 10> v;
    v.assign(v_src.begin(), v_src.end());
    EXPECT_FALSE(v.empty());
    EXPECT_EQ(5u, v.size());
    EXPECT_EQ(static_cast<int>(0), v[0]);
    EXPECT_EQ(1, v[1]);
    EXPECT_EQ(2, v[2]);
    EXPECT_EQ(3, v[3]);
    EXPECT_EQ(4, v[4]);

    std::vector<std::string> vs_src{"0","1","2","3","4"};
    vector_s<std::string, 10> vs;
    vs.assign(vs_src.begin(), vs_src.end());
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);
}